

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_bitmap_iterate(roaring64_bitmap_t *r,roaring_iterator64 iterator,void *ptr)

{
  art_val_t *paVar1;
  _Bool _Var2;
  ulong uVar3;
  uint base;
  ulong uVar4;
  array_container_t *cont;
  art_iterator_t it;
  
  art_init_iterator(&it,&r->art,true);
  while (paVar1 = it.value, it.value != (art_val_t *)0x0) {
    uVar3 = *it.value;
    cont = (array_container_t *)r->containers[uVar3 >> 8];
    if ((char)uVar3 == '\x04') {
      uVar3 = (ulong)*(byte *)&cont->array;
      cont = *(array_container_t **)cont;
    }
    uVar4 = (ulong)CONCAT24(it.key._4_2_,it.key._0_4_);
    base = (uint)(((ulong)(ushort)it.key._4_2_ << 0x20) >> 0x18) & 0xff0000 |
           (uint)(((ulong)(ushort)it.key._4_2_ << 0x20) >> 8);
    uVar4 = (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
            uVar4 << 0x38;
    if ((char)uVar3 == '\x01') {
      _Var2 = bitset_container_iterate64((bitset_container_t *)cont,base,iterator,uVar4,ptr);
    }
    else if (((uint)uVar3 & 0xff) == 3) {
      _Var2 = run_container_iterate64((run_container_t *)cont,base,iterator,uVar4,ptr);
    }
    else {
      _Var2 = array_container_iterate64(cont,base,iterator,uVar4,ptr);
    }
    if (_Var2 == false) break;
    art_iterator_next(&it);
  }
  return paVar1 == (art_val_t *)0x0;
}

Assistant:

bool roaring64_bitmap_iterate(const roaring64_bitmap_t *r,
                              roaring_iterator64 iterator, void *ptr) {
    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    while (it.value != NULL) {
        uint64_t high48 = combine_key(it.key, 0);
        uint64_t high32 = high48 & 0xFFFFFFFF00000000ULL;
        uint32_t low32 = high48;
        leaf_t leaf = (leaf_t)*it.value;
        if (!container_iterate64(get_container(r, leaf), get_typecode(leaf),
                                 low32, iterator, high32, ptr)) {
            return false;
        }
        art_iterator_next(&it);
    }
    return true;
}